

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QFixed __thiscall
QTextDocumentLayoutPrivate::scaleToDevice(QTextDocumentLayoutPrivate *this,QFixed value)

{
  long lVar1;
  QPaintDevice *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  QFixed local_18;
  QFixed value_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractTextDocumentLayoutPrivate).paintDevice;
  value_local.val = value.val;
  if (pQVar2 != (QPaintDevice *)0x0) {
    iVar3 = (*pQVar2->_vptr_QPaintDevice[4])(pQVar2,8);
    local_18 = QFixed::operator*(&value_local,iVar3 << 6);
    iVar3 = qt_defaultDpi();
    value = QFixed::operator/(&local_18,iVar3 << 6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QFixed)value.val;
  }
  __stack_chk_fail();
}

Assistant:

QFixed QTextDocumentLayoutPrivate::scaleToDevice(QFixed value) const
{
    if (!paintDevice)
        return value;
    return value * QFixed(paintDevice->logicalDpiY()) / QFixed(qt_defaultDpi());
}